

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void highbd_dr_prediction_z3_16x32_avx2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *left,int upsample_left,int dy,int bd)

{
  undefined8 *puVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  short sVar22;
  short sVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  int iVar37;
  int iVar38;
  long lVar39;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  int i_5;
  int i_4;
  int i_3;
  int j_2;
  int i_2;
  __m256i d [32];
  __m256i dstvec [32];
  int mdif;
  int j;
  __m256i shift;
  int i;
  int base;
  __m256i res;
  __m256i b;
  int r;
  int x;
  __m256i mask256;
  __m256i base_inc256;
  __m256i max_base_x256;
  __m256i diff;
  __m256i a_mbase_x;
  __m256i c3f;
  __m256i a16;
  __m256i a32;
  __m256i a1;
  __m256i a0;
  int max_base_x;
  int frac_bits;
  int mdif_1;
  int j_1;
  __m256i shift_1;
  int i_1;
  int base_1;
  __m256i res1;
  __m256i res_1 [2];
  __m256i b_1;
  int r_1;
  int x_1;
  __m256i mask256_1;
  __m256i base_inc256_1;
  __m256i max_base_x256_1;
  __m256i diff_1;
  __m256i a_mbase_x_1;
  __m256i c3f_1;
  __m256i a16_1;
  __m256i a32_1;
  __m256i a1_1;
  __m256i a1_2;
  __m256i a0_1;
  __m256i a0_2;
  int max_base_x_1;
  int frac_bits_1;
  int local_19b4;
  int local_19b0;
  int local_19ac;
  int local_19a8;
  int local_19a4;
  undefined8 local_19a0 [2];
  undefined1 auStackY_1990 [56];
  __m256i *in_stack_ffffffffffffe6a8;
  __m256i *in_stack_ffffffffffffe6b0;
  undefined8 auStack_18a0 [160];
  undefined8 auStack_13a0 [70];
  long local_1170;
  long local_1168;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  int local_10a8;
  int local_10a4;
  undefined1 local_10a0 [32];
  int local_1068;
  int local_1064;
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  int local_1008;
  uint local_1004;
  undefined1 local_1000 [32];
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined1 local_fa0 [32];
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined1 local_f60 [16];
  undefined1 auStack_f50 [16];
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined1 local_f20 [32];
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined4 local_ea8;
  undefined4 local_ea4;
  undefined8 *local_e90;
  undefined4 local_e84;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  ushort local_dfa;
  undefined2 local_df8;
  undefined2 local_df6;
  ushort local_df4;
  undefined2 local_df2;
  undefined1 (*local_df0) [32];
  undefined1 (*local_de8) [32];
  undefined1 local_de0 [16];
  undefined1 auStack_dd0 [16];
  undefined2 local_dc0;
  undefined2 local_dbe;
  undefined2 local_dbc;
  undefined2 local_dba;
  undefined2 local_db8;
  undefined2 local_db6;
  undefined2 local_db4;
  undefined2 local_db2;
  undefined2 local_db0;
  undefined2 local_dae;
  undefined2 local_dac;
  undefined2 local_daa;
  undefined2 local_da8;
  undefined2 local_da6;
  undefined2 local_da4;
  undefined2 local_da2;
  undefined1 local_da0 [16];
  undefined1 auStack_d90 [16];
  ushort local_d80;
  ushort local_d7e;
  ushort local_d7c;
  ushort local_d7a;
  ushort local_d78;
  ushort local_d76;
  ushort local_d74;
  ushort local_d72;
  ushort local_d70;
  ushort local_d6e;
  ushort local_d6c;
  ushort local_d6a;
  ushort local_d68;
  ushort local_d66;
  ushort local_d64;
  ushort local_d62;
  undefined1 local_d60 [16];
  undefined1 auStack_d50 [16];
  undefined2 local_d40;
  undefined2 local_d3e;
  undefined2 local_d3c;
  undefined2 local_d3a;
  undefined2 local_d38;
  undefined2 local_d36;
  undefined2 local_d34;
  undefined2 local_d32;
  undefined2 local_d30;
  undefined2 local_d2e;
  undefined2 local_d2c;
  undefined2 local_d2a;
  undefined2 local_d28;
  undefined2 local_d26;
  undefined2 local_d24;
  undefined2 local_d22;
  undefined1 local_d20 [32];
  undefined2 local_d00;
  undefined2 local_cfe;
  undefined2 local_cfc;
  undefined2 local_cfa;
  undefined2 local_cf8;
  undefined2 local_cf6;
  undefined2 local_cf4;
  undefined2 local_cf2;
  undefined2 local_cf0;
  undefined2 local_cee;
  undefined2 local_cec;
  undefined2 local_cea;
  undefined2 local_ce8;
  undefined2 local_ce6;
  undefined2 local_ce4;
  undefined2 local_ce2;
  undefined1 local_ce0 [32];
  ushort local_cc0;
  ushort local_cbe;
  ushort local_cbc;
  ushort local_cba;
  ushort local_cb8;
  ushort local_cb6;
  ushort local_cb4;
  ushort local_cb2;
  ushort local_cb0;
  ushort local_cae;
  ushort local_cac;
  ushort local_caa;
  ushort local_ca8;
  ushort local_ca6;
  ushort local_ca4;
  ushort local_ca2;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined1 local_c20 [16];
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined1 local_c00 [16];
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined4 local_bc4;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined4 local_b84;
  undefined1 local_b80 [32];
  undefined4 local_b44;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  ushort local_ae0;
  ushort local_ade;
  ushort local_adc;
  ushort local_ada;
  ushort local_ad8;
  ushort local_ad6;
  ushort local_ad4;
  ushort local_ad2;
  ushort local_ad0;
  ushort local_ace;
  ushort local_acc;
  ushort local_aca;
  ushort local_ac8;
  ushort local_ac6;
  ushort local_ac4;
  ushort local_ac2;
  undefined1 local_ac0 [16];
  undefined1 auStack_ab0 [16];
  ushort local_aa0;
  ushort local_a9e;
  ushort local_a9c;
  ushort local_a9a;
  ushort local_a98;
  ushort local_a96;
  ushort local_a94;
  ushort local_a92;
  ushort local_a90;
  ushort local_a8e;
  ushort local_a8c;
  ushort local_a8a;
  ushort local_a88;
  ushort local_a86;
  ushort local_a84;
  ushort local_a82;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  int local_a08;
  int local_a04;
  undefined1 local_a00 [32];
  int local_9c8;
  int local_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  int local_928;
  uint local_924;
  undefined1 local_920 [32];
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined1 local_8c0 [32];
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined1 local_880 [16];
  undefined1 auStack_870 [16];
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined4 local_790;
  undefined4 local_78c;
  undefined8 *local_778;
  undefined4 local_76c;
  undefined2 local_766;
  undefined2 local_764;
  ushort local_762;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined1 local_720 [16];
  undefined1 auStack_710 [16];
  ushort local_700;
  ushort local_6fe;
  ushort local_6fc;
  ushort local_6fa;
  ushort local_6f8;
  ushort local_6f6;
  ushort local_6f4;
  ushort local_6f2;
  ushort local_6f0;
  ushort local_6ee;
  ushort local_6ec;
  ushort local_6ea;
  ushort local_6e8;
  ushort local_6e6;
  ushort local_6e4;
  ushort local_6e2;
  undefined1 local_6e0 [16];
  undefined1 auStack_6d0 [16];
  undefined2 local_6c0;
  undefined2 local_6be;
  undefined2 local_6bc;
  undefined2 local_6ba;
  undefined2 local_6b8;
  undefined2 local_6b6;
  undefined2 local_6b4;
  undefined2 local_6b2;
  undefined2 local_6b0;
  undefined2 local_6ae;
  undefined2 local_6ac;
  undefined2 local_6aa;
  undefined2 local_6a8;
  undefined2 local_6a6;
  undefined2 local_6a4;
  undefined2 local_6a2;
  undefined1 local_6a0 [32];
  undefined2 local_680;
  undefined2 local_67e;
  undefined2 local_67c;
  undefined2 local_67a;
  undefined2 local_678;
  undefined2 local_676;
  undefined2 local_674;
  undefined2 local_672;
  undefined2 local_670;
  undefined2 local_66e;
  undefined2 local_66c;
  undefined2 local_66a;
  undefined2 local_668;
  undefined2 local_666;
  undefined2 local_664;
  undefined2 local_662;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 local_620 [16];
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined1 local_600 [16];
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined1 (*local_5c8) [16];
  undefined1 (*local_5c0) [16];
  undefined1 (*local_5b8) [16];
  undefined1 (*local_5b0) [16];
  uint local_5a8;
  undefined4 local_5a4;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined1 local_560 [16];
  undefined1 auStack_550 [16];
  undefined4 local_540;
  undefined4 local_53c;
  undefined4 local_538;
  undefined4 local_534;
  undefined4 local_530;
  undefined4 local_52c;
  undefined4 local_528;
  undefined4 local_524;
  undefined1 local_520 [32];
  uint local_4e4;
  uint local_4e0;
  uint local_4dc;
  uint local_4d8;
  uint local_4d4;
  uint local_4d0;
  uint local_4cc;
  uint local_4c8;
  undefined4 local_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined4 local_484;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined4 local_444;
  undefined1 local_440 [32];
  undefined4 local_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined4 local_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  ushort local_1a0;
  ushort local_19e;
  ushort local_19c;
  ushort local_19a;
  ushort local_198;
  ushort local_196;
  ushort local_194;
  ushort local_192;
  ushort local_190;
  ushort local_18e;
  ushort local_18c;
  ushort local_18a;
  ushort local_188;
  ushort local_186;
  ushort local_184;
  ushort local_182;
  undefined1 local_180 [16];
  undefined1 auStack_170 [16];
  ushort local_160;
  ushort local_15e;
  ushort local_15c;
  ushort local_15a;
  ushort local_158;
  ushort local_156;
  ushort local_154;
  ushort local_152;
  ushort local_150;
  ushort local_14e;
  ushort local_14c;
  ushort local_14a;
  ushort local_148;
  ushort local_146;
  ushort local_144;
  ushort local_142;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar7._8_8_ = local_620._8_8_;
  auVar7._0_8_ = local_620._0_8_;
  auVar14._8_8_ = local_c20._8_8_;
  auVar14._0_8_ = local_c20._0_8_;
  auVar43._8_8_ = local_600._8_8_;
  auVar43._0_8_ = local_600._0_8_;
  auVar42._24_8_ = auStack_870._8_8_;
  auVar42._16_8_ = auStack_870._0_8_;
  auVar42._8_8_ = local_880._8_8_;
  auVar42._0_8_ = local_880._0_8_;
  auVar41._8_8_ = local_c00._8_8_;
  auVar41._0_8_ = local_c00._0_8_;
  auVar40._24_8_ = auStack_f50._8_8_;
  auVar40._16_8_ = auStack_f50._0_8_;
  auVar40._8_8_ = local_f60._8_8_;
  auVar40._0_8_ = local_f60._0_8_;
  if (in_R9D < 0xc) {
    local_e84 = 0x10;
    puVar1 = auStack_18a0 + 0x60;
    local_ea4 = 6;
    local_df2 = 0x10;
    local_da2 = 0x10;
    local_da4 = 0x10;
    local_da6 = 0x10;
    local_da8 = 0x10;
    local_daa = 0x10;
    local_dac = 0x10;
    local_dae = 0x10;
    local_db0 = 0x10;
    local_db2 = 0x10;
    local_db4 = 0x10;
    local_db6 = 0x10;
    local_db8 = 0x10;
    local_dba = 0x10;
    local_dbc = 0x10;
    local_dbe = 0x10;
    local_dc0 = 0x10;
    auVar40._0_16_ = vpinsrw_avx(ZEXT216(0x10),0x10,1);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x10,2);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x10,3);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x10,4);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x10,5);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x10,6);
    auVar8 = vpinsrw_avx(auVar40._0_16_,0x10,7);
    auVar40._0_16_ = vpinsrw_avx(ZEXT216(0x10),0x10,1);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x10,2);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x10,3);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x10,4);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x10,5);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x10,6);
    auVar9 = vpinsrw_avx(auVar40._0_16_,0x10,7);
    local_de0._0_8_ = auVar8._0_8_;
    local_de0._8_8_ = auVar8._8_8_;
    auStack_dd0._0_8_ = auVar9._0_8_;
    auStack_dd0._8_8_ = auVar9._8_8_;
    local_f40 = local_de0._0_8_;
    uStack_f38 = local_de0._8_8_;
    uStack_f30 = auStack_dd0._0_8_;
    uStack_f28 = auStack_dd0._8_8_;
    uVar2 = *(ushort *)(in_RDX + 0x5e);
    auVar40._0_16_ = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,(uint)uVar2,2);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,(uint)uVar2,3);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,(uint)uVar2,4);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,(uint)uVar2,5);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,(uint)uVar2,6);
    auVar10 = vpinsrw_avx(auVar40._0_16_,(uint)uVar2,7);
    auVar40._0_16_ = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,(uint)uVar2,2);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,(uint)uVar2,3);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,(uint)uVar2,4);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,(uint)uVar2,5);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,(uint)uVar2,6);
    auVar11 = vpinsrw_avx(auVar40._0_16_,(uint)uVar2,7);
    local_da0._0_8_ = auVar10._0_8_;
    local_da0._8_8_ = auVar10._8_8_;
    auStack_d90._0_8_ = auVar11._0_8_;
    auStack_d90._8_8_ = auVar11._8_8_;
    local_f80 = local_da0._0_8_;
    uStack_f78 = local_da0._8_8_;
    uStack_f70 = auStack_d90._0_8_;
    uStack_f68 = auStack_d90._8_8_;
    local_df6 = 0x2f;
    local_d22 = 0x2f;
    local_d24 = 0x2f;
    local_d26 = 0x2f;
    local_d28 = 0x2f;
    local_d2a = 0x2f;
    local_d2c = 0x2f;
    local_d2e = 0x2f;
    local_d30 = 0x2f;
    local_d32 = 0x2f;
    local_d34 = 0x2f;
    local_d36 = 0x2f;
    local_d38 = 0x2f;
    local_d3a = 0x2f;
    local_d3c = 0x2f;
    local_d3e = 0x2f;
    local_d40 = 0x2f;
    auVar40._0_16_ = vpinsrw_avx(ZEXT216(0x2f),0x2f,1);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x2f,2);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x2f,3);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x2f,4);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x2f,5);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x2f,6);
    auVar12 = vpinsrw_avx(auVar40._0_16_,0x2f,7);
    auVar40._0_16_ = vpinsrw_avx(ZEXT216(0x2f),0x2f,1);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x2f,2);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x2f,3);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x2f,4);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x2f,5);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x2f,6);
    auVar13 = vpinsrw_avx(auVar40._0_16_,0x2f,7);
    local_d60._0_8_ = auVar12._0_8_;
    local_d60._8_8_ = auVar12._8_8_;
    auStack_d50._0_8_ = auVar13._0_8_;
    auStack_d50._8_8_ = auVar13._8_8_;
    local_fc0 = local_d60._0_8_;
    uStack_fb8 = local_d60._8_8_;
    uStack_fb0 = auStack_d50._0_8_;
    uStack_fa8 = auStack_d50._8_8_;
    local_df8 = 0x3f;
    local_ce2 = 0x3f;
    local_ce4 = 0x3f;
    local_ce6 = 0x3f;
    local_ce8 = 0x3f;
    local_cea = 0x3f;
    local_cec = 0x3f;
    local_cee = 0x3f;
    local_cf0 = 0x3f;
    local_cf2 = 0x3f;
    local_cf4 = 0x3f;
    local_cf6 = 0x3f;
    local_cf8 = 0x3f;
    local_cfa = 0x3f;
    local_cfc = 0x3f;
    local_cfe = 0x3f;
    local_d00 = 0x3f;
    auVar40._0_16_ = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x3f,2);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x3f,3);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x3f,4);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x3f,5);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x3f,6);
    auVar40._16_16_ = vpinsrw_avx(auVar40._0_16_,0x3f,7);
    auVar40._0_16_ = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x3f,2);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x3f,3);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x3f,4);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x3f,5);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x3f,6);
    auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,0x3f,7);
    auVar40._0_16_ = ZEXT116(0) * auVar40._16_16_ + ZEXT116(1) * auVar40._0_16_;
    auVar40._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar40._16_16_;
    local_d20._16_8_ = auVar40._16_8_;
    local_d20._24_8_ = auVar40._24_8_;
    local_1004 = in_R8D;
    for (local_1008 = 0; local_ea8 = 0x2f, local_e90 = puVar1, local_df4 = uVar2, local_d80 = uVar2,
        local_d7e = uVar2, local_d7c = uVar2, local_d7a = uVar2, local_d78 = uVar2,
        local_d76 = uVar2, local_d74 = uVar2, local_d72 = uVar2, local_d70 = uVar2,
        local_d6e = uVar2, local_d6c = uVar2, local_d6a = uVar2, local_d68 = uVar2,
        local_d66 = uVar2, local_d64 = uVar2, local_d62 = uVar2, auVar19 = auVar40,
        auVar15 = local_720, auVar16 = auStack_710, auVar17 = local_6e0, auVar18 = auStack_6d0,
        auVar21 = local_6a0, auVar5 = local_560, auVar6 = auStack_550, local_1008 < 0x10;
        local_1008 = local_1008 + 1) {
      iVar37 = (int)local_1004 >> 6;
      local_1064 = iVar37;
      if (0x2e < iVar37) {
        for (local_1068 = local_1008; local_1068 < 0x10; local_1068 = local_1068 + 1) {
          lVar39 = (long)local_1068;
          puVar1[lVar39 * 4] = local_da0._0_8_;
          auStack_13a0[lVar39 * 4 + -0x3f] = local_da0._8_8_;
          auStack_13a0[lVar39 * 4 + -0x3e] = auStack_d90._0_8_;
          auStack_13a0[lVar39 * 4 + -0x3d] = auStack_d90._8_8_;
          lVar39 = (long)(local_1068 + 0x10);
          puVar1[lVar39 * 4] = local_da0._0_8_;
          auStack_13a0[lVar39 * 4 + -0x3f] = local_da0._8_8_;
          auStack_13a0[lVar39 * 4 + -0x3e] = auStack_d90._0_8_;
          auStack_13a0[lVar39 * 4 + -0x3d] = auStack_d90._8_8_;
        }
        break;
      }
      uVar3 = (ushort)local_1004;
      auVar41._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1004),local_1004 & 0xffff,1);
      auVar41._0_16_ = vpinsrw_avx(auVar41._0_16_,local_1004 & 0xffff,2);
      auVar41._0_16_ = vpinsrw_avx(auVar41._0_16_,local_1004 & 0xffff,3);
      auVar41._0_16_ = vpinsrw_avx(auVar41._0_16_,local_1004 & 0xffff,4);
      auVar41._0_16_ = vpinsrw_avx(auVar41._0_16_,local_1004 & 0xffff,5);
      auVar41._0_16_ = vpinsrw_avx(auVar41._0_16_,local_1004 & 0xffff,6);
      auVar14 = vpinsrw_avx(auVar41._0_16_,local_1004 & 0xffff,7);
      auVar41._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1004),local_1004 & 0xffff,1);
      auVar41._0_16_ = vpinsrw_avx(auVar41._0_16_,local_1004 & 0xffff,2);
      auVar41._0_16_ = vpinsrw_avx(auVar41._0_16_,local_1004 & 0xffff,3);
      auVar41._0_16_ = vpinsrw_avx(auVar41._0_16_,local_1004 & 0xffff,4);
      auVar41._0_16_ = vpinsrw_avx(auVar41._0_16_,local_1004 & 0xffff,5);
      auVar41._0_16_ = vpinsrw_avx(auVar41._0_16_,local_1004 & 0xffff,6);
      auVar41._0_16_ = vpinsrw_avx(auVar41._0_16_,local_1004 & 0xffff,7);
      auVar41._0_16_ = ZEXT116(0) * auVar14 + ZEXT116(1) * auVar41._0_16_;
      auVar41._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar14;
      local_ce0._16_8_ = auVar41._16_8_;
      uVar24 = local_ce0._16_8_;
      local_ce0._24_8_ = auVar41._24_8_;
      uVar25 = local_ce0._24_8_;
      auVar30._16_8_ = local_ce0._16_8_;
      auVar30._0_16_ = auVar41._0_16_;
      auVar30._24_8_ = local_ce0._24_8_;
      auVar29._16_8_ = local_d20._16_8_;
      auVar29._0_16_ = auVar40._0_16_;
      auVar29._24_8_ = local_d20._24_8_;
      auVar19 = vpand_avx2(auVar30,auVar29);
      local_b84 = 1;
      auVar21 = vpsrlw_avx2(auVar19,ZEXT416(1));
      for (local_10a4 = 0; local_10a4 < 0x20; local_10a4 = local_10a4 + 0x10) {
        iVar38 = 0x2f - (iVar37 + local_10a4);
        if (iVar38 < 1) {
          local_1060._16_8_ = auStack_d90._0_8_;
          local_1060._0_16_ = auVar10;
          local_1060._24_8_ = auStack_d90._8_8_;
        }
        else {
          local_de8 = (undefined1 (*) [32])(in_RDX + (long)iVar37 * 2 + (long)local_10a4 * 2);
          local_ee0 = *(undefined8 *)*local_de8;
          uStack_ed8 = *(undefined8 *)(*local_de8 + 8);
          uStack_ed0 = *(undefined8 *)(*local_de8 + 0x10);
          uStack_ec8 = *(undefined8 *)(*local_de8 + 0x18);
          local_df0 = (undefined1 (*) [32])(in_RDX + (long)iVar37 * 2 + 2 + (long)local_10a4 * 2);
          local_f00 = *(undefined8 *)*local_df0;
          uStack_ef8 = *(undefined8 *)(*local_df0 + 8);
          uStack_ef0 = *(undefined8 *)(*local_df0 + 0x10);
          uStack_ee8 = *(undefined8 *)(*local_df0 + 0x18);
          local_fa0 = vpsubw_avx2(*local_df0,*local_de8);
          local_b44 = 5;
          auVar20 = vpsllw_avx2(*local_de8,ZEXT416(5));
          local_f20._0_8_ = auVar20._0_8_;
          local_f20._8_8_ = auVar20._8_8_;
          local_f20._16_8_ = auVar20._16_8_;
          local_f20._24_8_ = auVar20._24_8_;
          local_e20 = local_f20._0_8_;
          uStack_e18 = local_f20._8_8_;
          uStack_e10 = local_f20._16_8_;
          uStack_e08 = local_f20._24_8_;
          local_e40 = local_de0._0_8_;
          uStack_e38 = local_de0._8_8_;
          uStack_e30 = auStack_dd0._0_8_;
          uStack_e28 = auStack_dd0._8_8_;
          auVar26._16_8_ = auStack_dd0._0_8_;
          auVar26._0_16_ = auVar8;
          auVar26._24_8_ = auStack_dd0._8_8_;
          local_f20 = vpaddw_avx2(auVar20,auVar26);
          local_10a0._0_8_ = auVar21._0_8_;
          local_10a0._8_8_ = auVar21._8_8_;
          local_10a0._16_8_ = auVar21._16_8_;
          local_10a0._24_8_ = auVar21._24_8_;
          local_b00 = local_fa0._0_8_;
          uStack_af8 = local_fa0._8_8_;
          uStack_af0 = local_fa0._16_8_;
          uStack_ae8 = local_fa0._24_8_;
          local_b20 = local_10a0._0_8_;
          uStack_b18 = local_10a0._8_8_;
          uStack_b10 = local_10a0._16_8_;
          uStack_b08 = local_10a0._24_8_;
          local_1040 = vpmullw_avx2(local_fa0,auVar21);
          local_e60 = local_f20._0_8_;
          uStack_e58 = local_f20._8_8_;
          uStack_e50 = local_f20._16_8_;
          uStack_e48 = local_f20._24_8_;
          local_e80 = local_1040._0_8_;
          uStack_e78 = local_1040._8_8_;
          uStack_e70 = local_1040._16_8_;
          uStack_e68 = local_1040._24_8_;
          auVar20 = vpaddw_avx2(local_f20,local_1040);
          local_1060._0_8_ = auVar20._0_8_;
          local_1060._8_8_ = auVar20._8_8_;
          local_1060._16_8_ = auVar20._16_8_;
          local_1060._24_8_ = auVar20._24_8_;
          local_bc0 = local_1060._0_8_;
          uStack_bb8 = local_1060._8_8_;
          uStack_bb0 = local_1060._16_8_;
          uStack_ba8 = local_1060._24_8_;
          local_bc4 = 5;
          auVar20 = vpsrlw_avx2(auVar20,ZEXT416(5));
          sVar22 = (short)iVar37;
          sVar23 = (short)local_10a4;
          local_ac2 = sVar22 + sVar23;
          local_ac4 = sVar22 + 1 + sVar23;
          local_ac6 = sVar22 + 2 + sVar23;
          local_ac8 = sVar22 + 3 + sVar23;
          local_aca = sVar22 + 4 + sVar23;
          local_acc = sVar22 + 5 + sVar23;
          local_ace = sVar22 + 6 + sVar23;
          local_ad0 = sVar22 + 7 + sVar23;
          local_ad2 = sVar22 + 8 + sVar23;
          local_ad4 = sVar22 + 9 + sVar23;
          local_ad6 = sVar22 + 10 + sVar23;
          local_ad8 = sVar22 + 0xb + sVar23;
          local_ada = sVar22 + 0xc + sVar23;
          local_adc = sVar22 + 0xd + sVar23;
          local_ade = sVar22 + 0xe + sVar23;
          local_ae0 = sVar22 + 0xf + sVar23;
          auVar14 = vpinsrw_avx(ZEXT216(local_ac2),(uint)local_ac4,1);
          auVar14 = vpinsrw_avx(auVar14,(uint)local_ac6,2);
          auVar14 = vpinsrw_avx(auVar14,(uint)local_ac8,3);
          auVar14 = vpinsrw_avx(auVar14,(uint)local_aca,4);
          auVar14 = vpinsrw_avx(auVar14,(uint)local_acc,5);
          auVar14 = vpinsrw_avx(auVar14,(uint)local_ace,6);
          local_ac0 = vpinsrw_avx(auVar14,(uint)local_ad0,7);
          auVar14 = vpinsrw_avx(ZEXT216(local_ad2),(uint)local_ad4,1);
          auVar14 = vpinsrw_avx(auVar14,(uint)local_ad6,2);
          auVar14 = vpinsrw_avx(auVar14,(uint)local_ad8,3);
          auVar14 = vpinsrw_avx(auVar14,(uint)local_ada,4);
          auVar14 = vpinsrw_avx(auVar14,(uint)local_adc,5);
          auVar14 = vpinsrw_avx(auVar14,(uint)local_ade,6);
          auStack_ab0 = vpinsrw_avx(auVar14,(uint)local_ae0,7);
          local_fe0 = local_ac0._0_8_;
          uStack_fd8 = local_ac0._8_8_;
          uStack_fd0 = auStack_ab0._0_8_;
          uStack_fc8 = auStack_ab0._8_8_;
          local_c40 = local_d60._0_8_;
          uStack_c38 = local_d60._8_8_;
          uStack_c30 = auStack_d50._0_8_;
          uStack_c28 = auStack_d50._8_8_;
          local_c60 = local_ac0._0_8_;
          uStack_c58 = local_ac0._8_8_;
          uStack_c50 = auStack_ab0._0_8_;
          uStack_c48 = auStack_ab0._8_8_;
          auVar28._16_8_ = auStack_d50._0_8_;
          auVar28._0_16_ = auVar12;
          auVar28._24_8_ = auStack_d50._8_8_;
          auVar27._16_8_ = auStack_ab0._0_8_;
          auVar27._0_16_ = local_ac0;
          auVar27._24_8_ = auStack_ab0._8_8_;
          local_1000 = vpcmpgtw_avx2(auVar28,auVar27);
          local_1060._0_8_ = auVar20._0_8_;
          local_1060._8_8_ = auVar20._8_8_;
          local_1060._16_8_ = auVar20._16_8_;
          local_1060._24_8_ = auVar20._24_8_;
          local_a40 = local_da0._0_8_;
          uStack_a38 = local_da0._8_8_;
          uStack_a30 = auStack_d90._0_8_;
          uStack_a28 = auStack_d90._8_8_;
          local_a60 = local_1060._0_8_;
          uStack_a58 = local_1060._8_8_;
          uStack_a50 = local_1060._16_8_;
          uStack_a48 = local_1060._24_8_;
          local_a80 = local_1000._0_8_;
          uStack_a78 = local_1000._8_8_;
          uStack_a70 = local_1000._16_8_;
          uStack_a68 = local_1000._24_8_;
          auVar31._16_8_ = auStack_d90._0_8_;
          auVar31._0_16_ = auVar10;
          auVar31._24_8_ = auStack_d90._8_8_;
          local_1060 = vpblendvb_avx2(auVar31,auVar20,local_1000);
          local_ca0 = local_ee0;
          uStack_c98 = uStack_ed8;
          uStack_c90 = uStack_ed0;
          uStack_c88 = uStack_ec8;
          local_c80 = local_f00;
          uStack_c78 = uStack_ef8;
          uStack_c70 = uStack_ef0;
          uStack_c68 = uStack_ee8;
          local_b40 = local_ee0;
          uStack_b38 = uStack_ed8;
          uStack_b30 = uStack_ed0;
          uStack_b28 = uStack_ec8;
          local_aa0 = local_ac2;
          local_a9e = local_ac4;
          local_a9c = local_ac6;
          local_a9a = local_ac8;
          local_a98 = local_aca;
          local_a96 = local_acc;
          local_a94 = local_ace;
          local_a92 = local_ad0;
          local_a90 = local_ad2;
          local_a8e = local_ad4;
          local_a8c = local_ad6;
          local_a8a = local_ad8;
          local_a88 = local_ada;
          local_a86 = local_adc;
          local_a84 = local_ade;
          local_a82 = local_ae0;
        }
        if (local_10a4 == 0) {
          lVar39 = (long)local_1008;
          puVar1[lVar39 * 4] = local_1060._0_8_;
          auStack_13a0[lVar39 * 4 + -0x3f] = local_1060._8_8_;
          auStack_13a0[lVar39 * 4 + -0x3e] = local_1060._16_8_;
          auStack_13a0[lVar39 * 4 + -0x3d] = local_1060._24_8_;
        }
        else {
          lVar39 = (long)(local_1008 + 0x10);
          puVar1[lVar39 * 4] = local_1060._0_8_;
          auStack_13a0[lVar39 * 4 + -0x3f] = local_1060._8_8_;
          auStack_13a0[lVar39 * 4 + -0x3e] = local_1060._16_8_;
          auStack_13a0[lVar39 * 4 + -0x3d] = local_1060._24_8_;
        }
        local_10a8 = iVar38;
      }
      local_1004 = in_R8D + local_1004;
      local_10a0 = auVar21;
      local_dfa = uVar3;
      local_ce0 = auVar41;
      local_cc0 = uVar3;
      local_cbe = uVar3;
      local_cbc = uVar3;
      local_cba = uVar3;
      local_cb8 = uVar3;
      local_cb6 = uVar3;
      local_cb4 = uVar3;
      local_cb2 = uVar3;
      local_cb0 = uVar3;
      local_cae = uVar3;
      local_cac = uVar3;
      local_caa = uVar3;
      local_ca8 = uVar3;
      local_ca6 = uVar3;
      local_ca4 = uVar3;
      local_ca2 = uVar3;
      uStack_c10 = local_d20._16_8_;
      uStack_c08 = local_d20._24_8_;
      uStack_bf0 = uVar24;
      uStack_be8 = uVar25;
      local_b80 = auVar19;
      auVar14 = auVar40._0_16_;
    }
  }
  else {
    local_76c = 0x10;
    puVar1 = auStack_18a0 + 0x60;
    local_78c = 6;
    local_5a4 = 0x10;
    local_524 = 0x10;
    local_528 = 0x10;
    local_52c = 0x10;
    local_530 = 0x10;
    local_534 = 0x10;
    local_538 = 0x10;
    local_53c = 0x10;
    local_540 = 0x10;
    auVar42._0_16_ = vpinsrd_avx(ZEXT416(0x10),0x10,1);
    auVar42._0_16_ = vpinsrd_avx(auVar42._0_16_,0x10,2);
    auVar5 = vpinsrd_avx(auVar42._0_16_,0x10,3);
    auVar42._0_16_ = vpinsrd_avx(ZEXT416(0x10),0x10,1);
    auVar42._0_16_ = vpinsrd_avx(auVar42._0_16_,0x10,2);
    auVar6 = vpinsrd_avx(auVar42._0_16_,0x10,3);
    local_560._0_8_ = auVar5._0_8_;
    local_560._8_8_ = auVar5._8_8_;
    auStack_550._0_8_ = auVar6._0_8_;
    auStack_550._8_8_ = auVar6._8_8_;
    local_860 = local_560._0_8_;
    uStack_858 = local_560._8_8_;
    uStack_850 = auStack_550._0_8_;
    uStack_848 = auStack_550._8_8_;
    uVar2 = *(ushort *)(in_RDX + 0x5e);
    auVar42._0_16_ = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,(uint)uVar2,2);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,(uint)uVar2,3);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,(uint)uVar2,4);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,(uint)uVar2,5);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,(uint)uVar2,6);
    auVar15 = vpinsrw_avx(auVar42._0_16_,(uint)uVar2,7);
    auVar42._0_16_ = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,(uint)uVar2,2);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,(uint)uVar2,3);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,(uint)uVar2,4);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,(uint)uVar2,5);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,(uint)uVar2,6);
    auVar16 = vpinsrw_avx(auVar42._0_16_,(uint)uVar2,7);
    local_720._0_8_ = auVar15._0_8_;
    local_720._8_8_ = auVar15._8_8_;
    auStack_710._0_8_ = auVar16._0_8_;
    auStack_710._8_8_ = auVar16._8_8_;
    local_8a0 = local_720._0_8_;
    uStack_898 = local_720._8_8_;
    uStack_890 = auStack_710._0_8_;
    uStack_888 = auStack_710._8_8_;
    local_764 = 0x2f;
    local_6a2 = 0x2f;
    local_6a4 = 0x2f;
    local_6a6 = 0x2f;
    local_6a8 = 0x2f;
    local_6aa = 0x2f;
    local_6ac = 0x2f;
    local_6ae = 0x2f;
    local_6b0 = 0x2f;
    local_6b2 = 0x2f;
    local_6b4 = 0x2f;
    local_6b6 = 0x2f;
    local_6b8 = 0x2f;
    local_6ba = 0x2f;
    local_6bc = 0x2f;
    local_6be = 0x2f;
    local_6c0 = 0x2f;
    auVar42._0_16_ = vpinsrw_avx(ZEXT216(0x2f),0x2f,1);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,0x2f,2);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,0x2f,3);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,0x2f,4);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,0x2f,5);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,0x2f,6);
    auVar17 = vpinsrw_avx(auVar42._0_16_,0x2f,7);
    auVar42._0_16_ = vpinsrw_avx(ZEXT216(0x2f),0x2f,1);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,0x2f,2);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,0x2f,3);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,0x2f,4);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,0x2f,5);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,0x2f,6);
    auVar18 = vpinsrw_avx(auVar42._0_16_,0x2f,7);
    local_6e0._0_8_ = auVar17._0_8_;
    local_6e0._8_8_ = auVar17._8_8_;
    auStack_6d0._0_8_ = auVar18._0_8_;
    auStack_6d0._8_8_ = auVar18._8_8_;
    local_8e0 = local_6e0._0_8_;
    uStack_8d8 = local_6e0._8_8_;
    uStack_8d0 = auStack_6d0._0_8_;
    uStack_8c8 = auStack_6d0._8_8_;
    local_766 = 0x3f;
    local_662 = 0x3f;
    local_664 = 0x3f;
    local_666 = 0x3f;
    local_668 = 0x3f;
    local_66a = 0x3f;
    local_66c = 0x3f;
    local_66e = 0x3f;
    local_670 = 0x3f;
    local_672 = 0x3f;
    local_674 = 0x3f;
    local_676 = 0x3f;
    local_678 = 0x3f;
    local_67a = 0x3f;
    local_67c = 0x3f;
    local_67e = 0x3f;
    local_680 = 0x3f;
    auVar42._0_16_ = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,0x3f,2);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,0x3f,3);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,0x3f,4);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,0x3f,5);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,0x3f,6);
    auVar42._16_16_ = vpinsrw_avx(auVar42._0_16_,0x3f,7);
    auVar42._0_16_ = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,0x3f,2);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,0x3f,3);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,0x3f,4);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,0x3f,5);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,0x3f,6);
    auVar42._0_16_ = vpinsrw_avx(auVar42._0_16_,0x3f,7);
    auVar42._0_16_ = ZEXT116(0) * auVar42._16_16_ + ZEXT116(1) * auVar42._0_16_;
    auVar42._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar42._16_16_;
    local_6a0._16_8_ = auVar42._16_8_;
    local_6a0._24_8_ = auVar42._24_8_;
    local_924 = in_R8D;
    for (local_928 = 0; auVar8 = local_de0, auVar9 = auStack_dd0, auVar10 = local_da0,
        auVar11 = auStack_d90, auVar12 = local_d60, auVar13 = auStack_d50, auVar19 = local_d20,
        local_790 = 0x2f, local_778 = puVar1, local_762 = uVar2, local_700 = uVar2,
        local_6fe = uVar2, local_6fc = uVar2, local_6fa = uVar2, local_6f8 = uVar2,
        local_6f6 = uVar2, local_6f4 = uVar2, local_6f2 = uVar2, local_6f0 = uVar2,
        local_6ee = uVar2, local_6ec = uVar2, local_6ea = uVar2, local_6e8 = uVar2,
        local_6e6 = uVar2, local_6e4 = uVar2, local_6e2 = uVar2, auVar21 = auVar42, local_928 < 0x10
        ; local_928 = local_928 + 1) {
      iVar37 = (int)local_924 >> 6;
      local_9c4 = iVar37;
      if (0x2e < iVar37) {
        for (local_9c8 = local_928; local_9c8 < 0x10; local_9c8 = local_9c8 + 1) {
          lVar39 = (long)local_9c8;
          puVar1[lVar39 * 4] = local_720._0_8_;
          auStack_13a0[lVar39 * 4 + -0x3f] = local_720._8_8_;
          auStack_13a0[lVar39 * 4 + -0x3e] = auStack_710._0_8_;
          auStack_13a0[lVar39 * 4 + -0x3d] = auStack_710._8_8_;
          lVar39 = (long)(local_9c8 + 0x10);
          puVar1[lVar39 * 4] = local_720._0_8_;
          auStack_13a0[lVar39 * 4 + -0x3f] = local_720._8_8_;
          auStack_13a0[lVar39 * 4 + -0x3e] = auStack_710._0_8_;
          auStack_13a0[lVar39 * 4 + -0x3d] = auStack_710._8_8_;
        }
        break;
      }
      uVar4 = local_924;
      auVar43._0_16_ = vpinsrd_avx(ZEXT416(local_924),local_924,1);
      auVar43._0_16_ = vpinsrd_avx(auVar43._0_16_,local_924,2);
      auVar7 = vpinsrd_avx(auVar43._0_16_,local_924,3);
      auVar43._0_16_ = vpinsrd_avx(ZEXT416(local_924),local_924,1);
      auVar43._0_16_ = vpinsrd_avx(auVar43._0_16_,local_924,2);
      auVar43._0_16_ = vpinsrd_avx(auVar43._0_16_,local_924,3);
      auVar43._0_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar43._0_16_;
      auVar43._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar7;
      local_520._16_8_ = auVar43._16_8_;
      local_520._24_8_ = auVar43._24_8_;
      auVar21._16_8_ = local_520._16_8_;
      auVar21._0_16_ = auVar43._0_16_;
      auVar21._24_8_ = local_520._24_8_;
      auVar19._16_8_ = local_6a0._16_8_;
      auVar19._0_16_ = auVar42._0_16_;
      auVar19._24_8_ = local_6a0._24_8_;
      auVar19 = vpand_avx2(auVar21,auVar19);
      local_444 = 1;
      auVar21 = vpsrld_avx2(auVar19,ZEXT416(1));
      for (local_a04 = 0; local_a04 < 0x20; local_a04 = local_a04 + 0x10) {
        iVar38 = 0x2f - (iVar37 + local_a04);
        if (iVar38 < 1) {
          local_9c0._16_8_ = auStack_710._0_8_;
          local_9c0._0_16_ = auVar15;
          local_9c0._24_8_ = auStack_710._8_8_;
        }
        else {
          local_5b0 = (undefined1 (*) [16])(in_RDX + (long)iVar37 * 2 + (long)local_a04 * 2);
          local_570 = *(undefined8 *)*local_5b0;
          uStack_568 = *(undefined8 *)(*local_5b0 + 8);
          local_7c0 = vpmovzxwd_avx2(*local_5b0);
          local_5b8 = (undefined1 (*) [16])(in_RDX + (long)iVar37 * 2 + 2 + (long)local_a04 * 2);
          local_580 = *(undefined8 *)*local_5b8;
          uStack_578 = *(undefined8 *)(*local_5b8 + 8);
          local_800 = vpmovzxwd_avx2(*local_5b8);
          local_340 = local_800._0_8_;
          uStack_338 = local_800._8_8_;
          uStack_330 = local_800._16_8_;
          uStack_328 = local_800._24_8_;
          local_360 = local_7c0._0_8_;
          uStack_358 = local_7c0._8_8_;
          uStack_350 = local_7c0._16_8_;
          uStack_348 = local_7c0._24_8_;
          local_8c0 = vpsubd_avx2(local_800,local_7c0);
          local_3c0 = local_7c0._0_8_;
          uStack_3b8 = local_7c0._8_8_;
          uStack_3b0 = local_7c0._16_8_;
          uStack_3a8 = local_7c0._24_8_;
          local_3c4 = 5;
          auVar20 = vpslld_avx2(local_7c0,ZEXT416(5));
          local_840._0_8_ = auVar20._0_8_;
          local_840._8_8_ = auVar20._8_8_;
          local_840._16_8_ = auVar20._16_8_;
          local_840._24_8_ = auVar20._24_8_;
          local_240 = local_840._0_8_;
          uStack_238 = local_840._8_8_;
          uStack_230 = local_840._16_8_;
          uStack_228 = local_840._24_8_;
          local_260 = local_560._0_8_;
          uStack_258 = local_560._8_8_;
          uStack_250 = auStack_550._0_8_;
          uStack_248 = auStack_550._8_8_;
          auVar34._16_8_ = auStack_550._0_8_;
          auVar34._0_16_ = auVar5;
          auVar34._24_8_ = auStack_550._8_8_;
          local_840 = vpaddd_avx2(auVar20,auVar34);
          local_a00._0_8_ = auVar21._0_8_;
          local_a00._8_8_ = auVar21._8_8_;
          local_a00._16_8_ = auVar21._16_8_;
          local_a00._24_8_ = auVar21._24_8_;
          local_1c0 = local_8c0._0_8_;
          uStack_1b8 = local_8c0._8_8_;
          uStack_1b0 = local_8c0._16_8_;
          uStack_1a8 = local_8c0._24_8_;
          local_1e0 = local_a00._0_8_;
          uStack_1d8 = local_a00._8_8_;
          uStack_1d0 = local_a00._16_8_;
          uStack_1c8 = local_a00._24_8_;
          local_960 = vpmulld_avx2(local_8c0,auVar21);
          local_280 = local_840._0_8_;
          uStack_278 = local_840._8_8_;
          uStack_270 = local_840._16_8_;
          uStack_268 = local_840._24_8_;
          local_2a0 = local_960._0_8_;
          uStack_298 = local_960._8_8_;
          uStack_290 = local_960._16_8_;
          uStack_288 = local_960._24_8_;
          auVar20 = vpaddd_avx2(local_840,local_960);
          local_9a0._0_8_ = auVar20._0_8_;
          local_9a0._8_8_ = auVar20._8_8_;
          local_9a0._16_8_ = auVar20._16_8_;
          local_9a0._24_8_ = auVar20._24_8_;
          local_480 = local_9a0._0_8_;
          uStack_478 = local_9a0._8_8_;
          uStack_470 = local_9a0._16_8_;
          uStack_468 = local_9a0._24_8_;
          local_484 = 5;
          auVar20 = vpsrld_avx2(auVar20,ZEXT416(5));
          local_9a0._0_8_ = auVar20._0_8_;
          local_9a0._8_8_ = auVar20._8_8_;
          local_9a0._16_8_ = auVar20._16_8_;
          local_9a0._24_8_ = auVar20._24_8_;
          local_730 = local_9a0._16_8_;
          uStack_728 = local_9a0._24_8_;
          local_80 = local_9a0._0_8_;
          uStack_78 = local_9a0._8_8_;
          uStack_70 = local_9a0._16_8_;
          uStack_68 = local_9a0._24_8_;
          local_a0 = local_9a0._16_8_;
          uStack_98 = local_9a0._24_8_;
          uStack_90 = 0;
          uStack_88 = 0;
          local_9a0 = vpackusdw_avx2(auVar20,ZEXT1632(auVar20._16_16_));
          if (iVar38 < 9) {
            local_980._16_8_ = auStack_710._0_8_;
            local_980._0_16_ = auVar15;
            local_980._24_8_ = auStack_710._8_8_;
          }
          else {
            local_5c0 = (undefined1 (*) [16])
                        (in_RDX + (long)iVar37 * 2 + 0x10 + (long)local_a04 * 2);
            local_590 = *(undefined8 *)*local_5c0;
            uStack_588 = *(undefined8 *)(*local_5c0 + 8);
            local_7e0 = vpmovzxwd_avx2(*local_5c0);
            local_5c8 = (undefined1 (*) [16])
                        (in_RDX + (long)iVar37 * 2 + 0x12 + (long)local_a04 * 2);
            local_5a0 = *(undefined8 *)*local_5c8;
            uStack_598 = *(undefined8 *)(*local_5c8 + 8);
            local_820 = vpmovzxwd_avx2(*local_5c8);
            local_380 = local_820._0_8_;
            uStack_378 = local_820._8_8_;
            uStack_370 = local_820._16_8_;
            uStack_368 = local_820._24_8_;
            local_3a0 = local_7e0._0_8_;
            uStack_398 = local_7e0._8_8_;
            uStack_390 = local_7e0._16_8_;
            uStack_388 = local_7e0._24_8_;
            local_8c0 = vpsubd_avx2(local_820,local_7e0);
            local_400 = local_7e0._0_8_;
            uStack_3f8 = local_7e0._8_8_;
            uStack_3f0 = local_7e0._16_8_;
            uStack_3e8 = local_7e0._24_8_;
            local_404 = 5;
            auVar20 = vpslld_avx2(local_7e0,ZEXT416(5));
            local_840._0_8_ = auVar20._0_8_;
            local_840._8_8_ = auVar20._8_8_;
            local_840._16_8_ = auVar20._16_8_;
            local_840._24_8_ = auVar20._24_8_;
            local_2c0 = local_840._0_8_;
            uStack_2b8 = local_840._8_8_;
            uStack_2b0 = local_840._16_8_;
            uStack_2a8 = local_840._24_8_;
            local_2e0 = local_560._0_8_;
            uStack_2d8 = local_560._8_8_;
            uStack_2d0 = auStack_550._0_8_;
            uStack_2c8 = auStack_550._8_8_;
            auVar33._16_8_ = auStack_550._0_8_;
            auVar33._0_16_ = auVar5;
            auVar33._24_8_ = auStack_550._8_8_;
            local_840 = vpaddd_avx2(auVar20,auVar33);
            local_200 = local_8c0._0_8_;
            uStack_1f8 = local_8c0._8_8_;
            uStack_1f0 = local_8c0._16_8_;
            uStack_1e8 = local_8c0._24_8_;
            local_220 = local_a00._0_8_;
            uStack_218 = local_a00._8_8_;
            uStack_210 = local_a00._16_8_;
            uStack_208 = local_a00._24_8_;
            local_960 = vpmulld_avx2(local_8c0,auVar21);
            local_300 = local_840._0_8_;
            uStack_2f8 = local_840._8_8_;
            uStack_2f0 = local_840._16_8_;
            uStack_2e8 = local_840._24_8_;
            local_320 = local_960._0_8_;
            uStack_318 = local_960._8_8_;
            uStack_310 = local_960._16_8_;
            uStack_308 = local_960._24_8_;
            auVar20 = vpaddd_avx2(local_840,local_960);
            local_980._0_8_ = auVar20._0_8_;
            local_980._8_8_ = auVar20._8_8_;
            local_980._16_8_ = auVar20._16_8_;
            local_980._24_8_ = auVar20._24_8_;
            local_4c0 = local_980._0_8_;
            uStack_4b8 = local_980._8_8_;
            uStack_4b0 = local_980._16_8_;
            uStack_4a8 = local_980._24_8_;
            local_4c4 = 5;
            auVar20 = vpsrld_avx2(auVar20,ZEXT416(5));
            local_980._0_8_ = auVar20._0_8_;
            local_980._8_8_ = auVar20._8_8_;
            local_980._16_8_ = auVar20._16_8_;
            local_980._24_8_ = auVar20._24_8_;
            local_740 = local_980._16_8_;
            uStack_738 = local_980._24_8_;
            local_c0 = local_980._0_8_;
            uStack_b8 = local_980._8_8_;
            uStack_b0 = local_980._16_8_;
            uStack_a8 = local_980._24_8_;
            local_e0 = local_980._16_8_;
            uStack_d8 = local_980._24_8_;
            uStack_d0 = 0;
            uStack_c8 = 0;
            local_980 = vpackusdw_avx2(auVar20,ZEXT1632(auVar20._16_16_));
          }
          local_760 = local_980._0_8_;
          uStack_758 = local_980._8_8_;
          uStack_750 = local_980._16_8_;
          uStack_748 = local_980._24_8_;
          local_120 = ZEXT116(0) * local_980._0_16_ + ZEXT116(1) * local_9a0._0_16_;
          auStack_110 = ZEXT116(0) * local_9a0._16_16_ + ZEXT116(1) * local_980._0_16_;
          sVar22 = (short)iVar37;
          sVar23 = (short)local_a04;
          local_182 = sVar22 + sVar23;
          local_184 = sVar22 + 1 + sVar23;
          local_186 = sVar22 + 2 + sVar23;
          local_188 = sVar22 + 3 + sVar23;
          local_18a = sVar22 + 4 + sVar23;
          local_18c = sVar22 + 5 + sVar23;
          local_18e = sVar22 + 6 + sVar23;
          local_190 = sVar22 + 7 + sVar23;
          local_192 = sVar22 + 8 + sVar23;
          local_194 = sVar22 + 9 + sVar23;
          local_196 = sVar22 + 10 + sVar23;
          local_198 = sVar22 + 0xb + sVar23;
          local_19a = sVar22 + 0xc + sVar23;
          local_19c = sVar22 + 0xd + sVar23;
          local_19e = sVar22 + 0xe + sVar23;
          local_1a0 = sVar22 + 0xf + sVar23;
          auVar7 = vpinsrw_avx(ZEXT216(local_182),(uint)local_184,1);
          auVar7 = vpinsrw_avx(auVar7,(uint)local_186,2);
          auVar7 = vpinsrw_avx(auVar7,(uint)local_188,3);
          auVar7 = vpinsrw_avx(auVar7,(uint)local_18a,4);
          auVar7 = vpinsrw_avx(auVar7,(uint)local_18c,5);
          auVar7 = vpinsrw_avx(auVar7,(uint)local_18e,6);
          local_180 = vpinsrw_avx(auVar7,(uint)local_190,7);
          auVar7 = vpinsrw_avx(ZEXT216(local_192),(uint)local_194,1);
          auVar7 = vpinsrw_avx(auVar7,(uint)local_196,2);
          auVar7 = vpinsrw_avx(auVar7,(uint)local_198,3);
          auVar7 = vpinsrw_avx(auVar7,(uint)local_19a,4);
          auVar7 = vpinsrw_avx(auVar7,(uint)local_19c,5);
          auVar7 = vpinsrw_avx(auVar7,(uint)local_19e,6);
          auStack_170 = vpinsrw_avx(auVar7,(uint)local_1a0,7);
          local_900 = local_180._0_8_;
          uStack_8f8 = local_180._8_8_;
          uStack_8f0 = auStack_170._0_8_;
          uStack_8e8 = auStack_170._8_8_;
          local_640 = local_6e0._0_8_;
          uStack_638 = local_6e0._8_8_;
          uStack_630 = auStack_6d0._0_8_;
          uStack_628 = auStack_6d0._8_8_;
          local_660 = local_180._0_8_;
          uStack_658 = local_180._8_8_;
          uStack_650 = auStack_170._0_8_;
          uStack_648 = auStack_170._8_8_;
          auVar32._16_8_ = auStack_6d0._0_8_;
          auVar32._0_16_ = auVar17;
          auVar32._24_8_ = auStack_6d0._8_8_;
          auVar20._16_8_ = auStack_170._0_8_;
          auVar20._0_16_ = local_180;
          auVar20._24_8_ = auStack_170._8_8_;
          local_920 = vpcmpgtw_avx2(auVar32,auVar20);
          local_9c0._16_8_ = auStack_110._0_8_;
          local_9c0._24_8_ = auStack_110._8_8_;
          local_100 = local_720._0_8_;
          uStack_f8 = local_720._8_8_;
          uStack_f0 = auStack_710._0_8_;
          uStack_e8 = auStack_710._8_8_;
          local_140 = local_920._0_8_;
          uStack_138 = local_920._8_8_;
          uStack_130 = local_920._16_8_;
          uStack_128 = local_920._24_8_;
          auVar36._16_8_ = auStack_710._0_8_;
          auVar36._0_16_ = auVar15;
          auVar36._24_8_ = auStack_710._8_8_;
          auVar35._16_8_ = local_9c0._16_8_;
          auVar35._0_16_ = local_120;
          auVar35._24_8_ = local_9c0._24_8_;
          local_9c0 = vpblendvb_avx2(auVar36,auVar35,local_920);
          local_160 = local_182;
          local_15e = local_184;
          local_15c = local_186;
          local_15a = local_188;
          local_158 = local_18a;
          local_156 = local_18c;
          local_154 = local_18e;
          local_152 = local_190;
          local_150 = local_192;
          local_14e = local_194;
          local_14c = local_196;
          local_14a = local_198;
          local_148 = local_19a;
          local_146 = local_19c;
          local_144 = local_19e;
          local_142 = local_1a0;
        }
        if (local_a04 == 0) {
          lVar39 = (long)local_928;
          puVar1[lVar39 * 4] = local_9c0._0_8_;
          auStack_13a0[lVar39 * 4 + -0x3f] = local_9c0._8_8_;
          auStack_13a0[lVar39 * 4 + -0x3e] = local_9c0._16_8_;
          auStack_13a0[lVar39 * 4 + -0x3d] = local_9c0._24_8_;
        }
        else {
          lVar39 = (long)(local_928 + 0x10);
          puVar1[lVar39 * 4] = local_9c0._0_8_;
          auStack_13a0[lVar39 * 4 + -0x3f] = local_9c0._8_8_;
          auStack_13a0[lVar39 * 4 + -0x3e] = local_9c0._16_8_;
          auStack_13a0[lVar39 * 4 + -0x3d] = local_9c0._24_8_;
        }
        local_a08 = iVar38;
      }
      local_924 = in_R8D + local_924;
      local_a00 = auVar21;
      uStack_610 = local_6a0._16_8_;
      uStack_608 = local_6a0._24_8_;
      uStack_5f0 = local_520._16_8_;
      uStack_5e8 = local_520._24_8_;
      local_5a8 = uVar4;
      local_520 = auVar43;
      local_4e4 = uVar4;
      local_4e0 = uVar4;
      local_4dc = uVar4;
      local_4d8 = uVar4;
      local_4d4 = uVar4;
      local_4d0 = uVar4;
      local_4cc = uVar4;
      local_4c8 = uVar4;
      local_440 = auVar19;
      auVar7 = auVar42._0_16_;
    }
  }
  auStack_550 = auVar6;
  local_560 = auVar5;
  local_6a0 = auVar21;
  auStack_6d0 = auVar18;
  local_6e0 = auVar17;
  auStack_710 = auVar16;
  local_720 = auVar15;
  local_d20 = auVar19;
  auStack_d50 = auVar13;
  local_d60 = auVar12;
  auStack_d90 = auVar11;
  local_da0 = auVar10;
  auStack_dd0 = auVar9;
  local_de0 = auVar8;
  local_1170 = in_RSI;
  local_1168 = in_RDI;
  local_c20 = auVar14;
  local_620 = auVar7;
  for (local_19a4 = 0; local_19a4 < 0x20; local_19a4 = local_19a4 + 8) {
    local_f60 = auVar40._0_16_;
    auStack_f50 = auVar40._16_16_;
    local_880 = auVar42._0_16_;
    auStack_870 = auVar42._16_16_;
    local_c00 = auVar41._0_16_;
    local_600 = auVar43._0_16_;
    highbd_transpose8x16_16x8_avx2(in_stack_ffffffffffffe6b0,in_stack_ffffffffffffe6a8);
    auVar40._0_16_ = local_f60;
    auVar40._16_16_ = auStack_f50;
    auVar42._0_16_ = local_880;
    auVar42._16_16_ = auStack_870;
    auVar41._0_16_ = local_c00;
    auVar43._0_16_ = local_600;
  }
  for (local_19a8 = 0; local_19a8 < 0x20; local_19a8 = local_19a8 + 0x10) {
    for (local_19ac = 0; local_19ac < 8; local_19ac = local_19ac + 1) {
      lVar39 = (long)(local_19ac + local_19a8);
      puVar1 = (undefined8 *)(local_1168 + lVar39 * local_1170 * 2);
      uVar24 = *(undefined8 *)(auStackY_1990 + lVar39 * 0x20 + -8);
      *puVar1 = local_19a0[lVar39 * 4];
      puVar1[1] = uVar24;
    }
    for (local_19b0 = 0; local_19b0 < 8; local_19b0 = local_19b0 + 1) {
      lVar39 = (long)(local_19b0 + local_19a8);
      puVar1 = (undefined8 *)(local_1168 + 0x10 + lVar39 * local_1170 * 2);
      uVar24 = auStack_18a0[lVar39 * 4 + 1];
      *puVar1 = auStack_18a0[lVar39 * 4];
      puVar1[1] = uVar24;
    }
    for (local_19b4 = 8; local_19b4 < 0x10; local_19b4 = local_19b4 + 1) {
      puVar1 = (undefined8 *)(local_1168 + (local_19b4 + local_19a8) * local_1170 * 2);
      auVar40 = vblendps_avx(*(undefined1 (*) [32])
                              (local_19a0 + (long)(local_19b4 + local_19a8) * 4),
                             ZEXT1632(*(undefined1 (*) [16])
                                       (auStackY_1990 + (long)(local_19b4 + -8 + local_19a8) * 0x20)
                                     ),0xf);
      local_1120 = auVar40._0_8_;
      uStack_1118 = auVar40._8_8_;
      uStack_1110 = auVar40._16_8_;
      uStack_1108 = auVar40._24_8_;
      *puVar1 = local_1120;
      puVar1[1] = uStack_1118;
      puVar1[2] = uStack_1110;
      puVar1[3] = uStack_1108;
    }
  }
  return;
}

Assistant:

static void highbd_dr_prediction_z3_16x32_avx2(uint16_t *dst, ptrdiff_t stride,
                                               const uint16_t *left,
                                               int upsample_left, int dy,
                                               int bd) {
  __m256i dstvec[32], d[32];
  if (bd < 12) {
    highbd_dr_prediction_z1_32xN_internal_avx2(16, dstvec, left, upsample_left,
                                               dy);
  } else {
    highbd_dr_prediction_32bit_z1_32xN_internal_avx2(16, dstvec, left,
                                                     upsample_left, dy);
  }
  for (int i = 0; i < 32; i += 8) {
    highbd_transpose8x16_16x8_avx2(dstvec + i, d + i);
  }
  // store
  for (int j = 0; j < 32; j += 16) {
    for (int i = 0; i < 8; i++) {
      _mm_storeu_si128((__m128i *)(dst + (i + j) * stride),
                       _mm256_castsi256_si128(d[(i + j)]));
    }
    for (int i = 0; i < 8; i++) {
      _mm_storeu_si128((__m128i *)(dst + (i + j) * stride + 8),
                       _mm256_castsi256_si128(d[(i + j) + 8]));
    }
    for (int i = 8; i < 16; i++) {
      _mm256_storeu_si256(
          (__m256i *)(dst + (i + j) * stride),
          _mm256_inserti128_si256(
              d[(i + j)], _mm256_extracti128_si256(d[(i + j) - 8], 1), 0));
    }
  }
}